

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_parsed_linkage(lys_ypr_ctx *pctx,lysp_module *modp)

{
  uint16_t *puVar1;
  byte *pbVar2;
  ushort uVar3;
  uint uVar4;
  lysp_import *plVar5;
  lysp_include *plVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = 0;
  uVar9 = 0;
  do {
    plVar5 = modp->imports;
    if (plVar5 == (lysp_import *)0x0) {
LAB_00183e94:
      lVar8 = 0;
      uVar9 = 0;
      while( true ) {
        plVar6 = modp->includes;
        if (plVar6 == (lysp_include *)0x0) {
          return;
        }
        if (*(ulong *)(plVar6[-1].rev + 8) <= uVar9) break;
        if (plVar6->rev[lVar8 + 0xb] == '\0') {
          uVar3 = (pctx->field_0).field_0.flags;
          if (((uVar3 & 1) != 0) &&
             ((pctx->field_0).field_0.flags = uVar3 & 0xfffe,
             (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
             (undefined1  [24])0x0)) {
            ly_print_((pctx->field_0).field_0.out,"\n");
          }
          plVar6 = modp->includes;
          if ((((plVar6->rev[lVar8] == '\0') && (*(long *)(plVar6->rev + lVar8 + -0x18) == 0)) &&
              (*(long *)(plVar6->rev + lVar8 + -0x10) == 0)) &&
             (*(long *)(plVar6->rev + lVar8 + -8) == 0)) {
            uVar7 = 0;
            if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000)
                == (undefined1  [24])0x0) {
              uVar7 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
            }
            ly_print_((pctx->field_0).field_0.out,"\n%*sinclude \"%s\";\n",uVar7,"",
                      *(undefined8 *)(plVar6->rev + lVar8 + -0x20));
          }
          else {
            uVar7 = 0;
            if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000)
                == (undefined1  [24])0x0) {
              uVar7 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
            }
            ly_print_((pctx->field_0).field_0.out,"%*sinclude %s {\n",uVar7,"");
            puVar1 = &(pctx->field_0).field_0.level;
            *puVar1 = *puVar1 + 1;
            yprp_extension_instances
                      (pctx,LY_STMT_INCLUDE,'\0',
                       *(lysp_ext_instance **)(modp->includes->rev + lVar8 + -8),(ly_bool *)0x0);
            plVar6 = modp->includes;
            if (plVar6->rev[lVar8] != '\0') {
              ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar6->rev + lVar8,'\0',
                          *(void **)(plVar6->rev + lVar8 + -8));
              plVar6 = modp->includes;
            }
            ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',*(char **)(plVar6->rev + lVar8 + -0x18),'\0',
                        *(void **)(plVar6->rev + lVar8 + -8));
            ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',*(char **)(modp->includes->rev + lVar8 + -0x10),
                        '\0',*(void **)(modp->includes->rev + lVar8 + -8));
            uVar4 = *(int *)((long)&pctx->field_0 + 8) - 1;
            (pctx->field_0).field_0.level = (uint16_t)uVar4;
            uVar4 = (uVar4 & 0xffff) * 2;
            if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000)
                != (undefined1  [24])0x0) {
              uVar4 = 0;
            }
            ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar4,"");
          }
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x38;
      }
      pbVar2 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar2 = *pbVar2 | 1;
      return;
    }
    if (*(ulong *)(plVar5[-1].rev + 6) <= uVar9) {
      pbVar2 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar2 = *pbVar2 | 1;
      goto LAB_00183e94;
    }
    if ((plVar5->rev[lVar8 + -1] & 0x10U) == 0) {
      uVar3 = (pctx->field_0).field_0.flags;
      uVar4 = (pctx->field_0).field_0.options;
      if (((uVar3 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar3 & 0xfffe, (uVar4 & 2) == 0))
      {
        ly_print_((pctx->field_0).field_0.out,"\n");
        uVar4 = (pctx->field_0).field_0.options;
      }
      uVar7 = 0;
      if ((uVar4 & 2) == 0) {
        uVar7 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*simport %s {\n",uVar7,"");
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 + 1;
      yprp_extension_instances
                (pctx,LY_STMT_IMPORT,'\0',*(lysp_ext_instance **)(modp->imports->rev + lVar8 + -10),
                 (ly_bool *)0x0);
      ypr_substmt(pctx,LY_STMT_PREFIX,'\0',*(char **)(modp->imports->rev + lVar8 + -0x22),'\0',
                  *(void **)(modp->imports->rev + lVar8 + -10));
      plVar5 = modp->imports;
      if (plVar5->rev[lVar8] != '\0') {
        ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar5->rev + lVar8,'\0',
                    *(void **)(plVar5->rev + lVar8 + -10));
        plVar5 = modp->imports;
      }
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',*(char **)(plVar5->rev + lVar8 + -0x1a),'\0',
                  *(void **)(plVar5->rev + lVar8 + -10));
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',*(char **)(modp->imports->rev + lVar8 + -0x12),'\0',
                  *(void **)(modp->imports->rev + lVar8 + -10));
      uVar4 = *(int *)((long)&pctx->field_0 + 8) - 1;
      (pctx->field_0).field_0.level = (uint16_t)uVar4;
      uVar4 = (uVar4 & 0xffff) * 2;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
          (undefined1  [24])0x0) {
        uVar4 = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar4,"");
    }
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x40;
  } while( true );
}

Assistant:

static void
yang_print_parsed_linkage(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(modp->imports, u) {
        if (modp->imports[u].flags & LYS_INTERNAL) {
            continue;
        }

        YPR_EXTRA_LINE_PRINT(pctx);
        ly_print_(pctx->out, "%*simport %s {\n", INDENT, modp->imports[u].name);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_IMPORT, 0, modp->imports[u].exts, NULL);
        ypr_substmt(pctx, LY_STMT_PREFIX, 0, modp->imports[u].prefix, 0, modp->imports[u].exts);
        if (modp->imports[u].rev[0]) {
            ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->imports[u].rev, 0, modp->imports[u].exts);
        }
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->imports[u].dsc, 0, modp->imports[u].exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->imports[u].ref, 0, modp->imports[u].exts);
        LEVEL--;
        ly_print_(pctx->out, "%*s}\n", INDENT);
    }
    YPR_EXTRA_LINE(modp->imports, pctx);

    LY_ARRAY_FOR(modp->includes, u) {
        if (modp->includes[u].injected) {
            /* do not print the includes injected from submodules */
            continue;
        }
        YPR_EXTRA_LINE_PRINT(pctx);
        if (modp->includes[u].rev[0] || modp->includes[u].dsc || modp->includes[u].ref || modp->includes[u].exts) {
            ly_print_(pctx->out, "%*sinclude %s {\n", INDENT, modp->includes[u].name);
            LEVEL++;
            yprp_extension_instances(pctx, LY_STMT_INCLUDE, 0, modp->includes[u].exts, NULL);
            if (modp->includes[u].rev[0]) {
                ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->includes[u].rev, 0, modp->includes[u].exts);
            }
            ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->includes[u].dsc, 0, modp->includes[u].exts);
            ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->includes[u].ref, 0, modp->includes[u].exts);
            LEVEL--;
            ly_print_(pctx->out, "%*s}\n", INDENT);
        } else {
            ly_print_(pctx->out, "\n%*sinclude \"%s\";\n", INDENT, modp->includes[u].name);
        }
    }
    YPR_EXTRA_LINE(modp->includes, pctx);
}